

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::syncBackingStore(QWidgetPrivate *this)

{
  long lVar1;
  bool bVar2;
  QWidgetRepaintManager *this_00;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetRepaintManager *repaintManager;
  QRegion *in_stack_00000028;
  QWidgetPrivate *in_stack_00000030;
  QRegion *in_stack_ffffffffffffffe0;
  QRegion in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = shouldPaintOnScreen(in_RDI);
  if (bVar2) {
    paintOnScreen(in_stack_00000030,in_stack_00000028);
    QRegion::QRegion((QRegion *)&stack0xfffffffffffffff0);
    QRegion::operator=(in_stack_ffffffffffffffe0,(QRegion *)in_RDI);
    QRegion::~QRegion((QRegion *)&stack0xfffffffffffffff0);
  }
  else {
    this_00 = maybeRepaintManager((QWidgetPrivate *)in_stack_fffffffffffffff0.d);
    if (this_00 != (QWidgetRepaintManager *)0x0) {
      QWidgetRepaintManager::sync((QWidgetRepaintManager *)this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::syncBackingStore()
{
    if (shouldPaintOnScreen()) {
        paintOnScreen(dirty);
        dirty = QRegion();
    } else if (QWidgetRepaintManager *repaintManager = maybeRepaintManager()) {
        repaintManager->sync();
    }
}